

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CompleteInsertion
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int regNewData,int *aRegIdx,
               int update_flags,int appendBias,int useSeekResult)

{
  Vdbe *p;
  Index *pIVar1;
  byte bVar2;
  Index **ppIVar3;
  ulong uVar4;
  ushort uVar5;
  byte bVar6;
  
  p = pParse->pVdbe;
  bVar6 = (useSeekResult != 0) << 4;
  uVar4 = 0;
  ppIVar3 = &pTab->pIndex;
  while (pIVar1 = *ppIVar3, pIVar1 != (Index *)0x0) {
    if (aRegIdx[uVar4] != 0) {
      if (pIVar1->pPartIdxWhere != (Expr *)0x0) {
        sqlite3VdbeAddOp2(p,0x32,aRegIdx[uVar4],p->nOp + 2);
      }
      uVar5 = (ushort)bVar6;
      if ((*(ushort *)&pIVar1->field_0x63 & 3) == 2) {
        uVar5 = (ushort)(byte)(((byte)update_flags & 2 | bVar6) + 1);
        if ((pTab->tabFlags & 0x80) == 0) {
          uVar5 = (ushort)bVar6;
        }
      }
      sqlite3VdbeAddOp4Int
                (p,0x8a,iIdxCur + (int)uVar4,aRegIdx[uVar4],aRegIdx[uVar4] + 1,
                 (uint)(&pIVar1->nKeyCol)[(*(ushort *)&pIVar1->field_0x63 & 8) == 0]);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = uVar5;
      }
    }
    uVar4 = uVar4 + 1;
    ppIVar3 = &pIVar1->pNext;
  }
  if ((pTab->tabFlags & 0x80) == 0) {
    bVar6 = 0x21;
    if (update_flags != 0) {
      bVar6 = (byte)update_flags | 1;
    }
    bVar2 = 0;
    if (pParse->nested == '\0') {
      bVar2 = bVar6;
    }
    bVar6 = bVar2 | 8;
    if (appendBias == 0) {
      bVar6 = bVar2;
    }
    bVar2 = bVar6 | 0x10;
    if (useSeekResult == 0) {
      bVar2 = bVar6;
    }
    sqlite3VdbeAddOp3(p,0x80,iDataCur,aRegIdx[uVar4 & 0xffffffff],regNewData);
    if (pParse->nested == '\0') {
      sqlite3VdbeAppendP4(p,pTab,-5);
    }
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)bVar2;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CompleteInsertion(
  Parse *pParse,      /* The parser context */
  Table *pTab,        /* the table into which we are inserting */
  int iDataCur,       /* Cursor of the canonical data source */
  int iIdxCur,        /* First index cursor */
  int regNewData,     /* Range of content */
  int *aRegIdx,       /* Register used by each index.  0 for unused indices */
  int update_flags,   /* True for UPDATE, False for INSERT */
  int appendBias,     /* True if this is likely to be an append */
  int useSeekResult   /* True to set the USESEEKRESULT flag on OP_[Idx]Insert */
){
  Vdbe *v;            /* Prepared statements under construction */
  Index *pIdx;        /* An index being inserted or updated */
  u8 pik_flags;       /* flag values passed to the btree insert */
  int i;              /* Loop counter */

  assert( update_flags==0
       || update_flags==OPFLAG_ISUPDATE
       || update_flags==(OPFLAG_ISUPDATE|OPFLAG_SAVEPOSITION)
  );

  v = pParse->pVdbe;
  assert( v!=0 );
  assert( !IsView(pTab) );  /* This table is not a VIEW */
  for(i=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, i++){
    /* All REPLACE indexes are at the end of the list */
    assert( pIdx->onError!=OE_Replace
         || pIdx->pNext==0
         || pIdx->pNext->onError==OE_Replace );
    if( aRegIdx[i]==0 ) continue;
    if( pIdx->pPartIdxWhere ){
      sqlite3VdbeAddOp2(v, OP_IsNull, aRegIdx[i], sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
    }
    pik_flags = (useSeekResult ? OPFLAG_USESEEKRESULT : 0);
    if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
      pik_flags |= OPFLAG_NCHANGE;
      pik_flags |= (update_flags & OPFLAG_SAVEPOSITION);
      if( update_flags==0 ){
        codeWithoutRowidPreupdate(pParse, pTab, iIdxCur+i, aRegIdx[i]);
      }
    }
    sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iIdxCur+i, aRegIdx[i],
                         aRegIdx[i]+1,
                         pIdx->uniqNotNull ? pIdx->nKeyCol: pIdx->nColumn);
    sqlite3VdbeChangeP5(v, pik_flags);
  }
  if( !HasRowid(pTab) ) return;
  if( pParse->nested ){
    pik_flags = 0;
  }else{
    pik_flags = OPFLAG_NCHANGE;
    pik_flags |= (update_flags?update_flags:OPFLAG_LASTROWID);
  }
  if( appendBias ){
    pik_flags |= OPFLAG_APPEND;
  }
  if( useSeekResult ){
    pik_flags |= OPFLAG_USESEEKRESULT;
  }
  sqlite3VdbeAddOp3(v, OP_Insert, iDataCur, aRegIdx[i], regNewData);
  if( !pParse->nested ){
    sqlite3VdbeAppendP4(v, pTab, P4_TABLE);
  }
  sqlite3VdbeChangeP5(v, pik_flags);
}